

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFPageDocumentHelper::flattenAnnotations
          (QPDFPageDocumentHelper *this,int required_flags,int forbidden_flags)

{
  bool bVar1;
  reference name;
  allocator<char> local_1b1;
  string local_1b0;
  QPDFObjectHandle local_190;
  QPDFObjectHandle local_180;
  allocator<char> local_169;
  QPDFObjectHandle local_168 [2];
  undefined1 local_148 [40];
  string local_120 [32];
  undefined1 local_100 [8];
  QPDFObjectHandle resources;
  QPDFPageObjectHelper *ph;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  string local_b0;
  allocator<char> local_89;
  string local_88 [32];
  string local_68;
  undefined1 local_38 [8];
  QPDFAcroFormDocumentHelper afdh;
  int forbidden_flags_local;
  int required_flags_local;
  QPDFPageDocumentHelper *this_local;
  
  afdh.m.super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = forbidden_flags;
  afdh.m.super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = required_flags;
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper
            ((QPDFAcroFormDocumentHelper *)local_38,(this->super_QPDFDocumentHelper).qpdf);
  bVar1 = QPDFAcroFormDocumentHelper::getNeedAppearances((QPDFAcroFormDocumentHelper *)local_38);
  if (bVar1) {
    QPDF::getRoot((QPDF *)&local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_88,"/AcroForm",&local_89);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_68.field_2,&local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "document does not have updated appearance streams, so form fields will not be flattened"
               ,(allocator<char> *)((long)&__range1 + 7));
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_68.field_2,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_68.field_2);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_68);
  }
  getAllPages((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin1,this)
  ;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                     ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                      &__begin1);
  ph = (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end
                 ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                     *)&ph), bVar1) {
    name = __gnu_cxx::
           __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
           ::operator*(&__end1);
    resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_120,"/Resources",(allocator<char> *)(local_148 + 0x27));
    QPDFPageObjectHelper::getAttribute
              ((QPDFPageObjectHelper *)local_100,(string *)name,SUB81(local_120,0));
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)(local_148 + 0x27));
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_100);
    if (!bVar1) {
      QTC::TC("qpdf","QPDFPageDocumentHelper flatten resources missing or invalid",0);
      QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_148);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_168,"/Resources",&local_169);
      QPDFObjectHandle::newDictionary();
      QPDFObjectHandle::replaceKeyAndGetNew
                ((QPDFObjectHandle *)(local_148 + 0x10),(string *)local_148,local_168);
      QPDFObjectHandle::operator=
                ((QPDFObjectHandle *)local_100,(QPDFObjectHandle *)(local_148 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_148 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle(&local_180);
      std::__cxx11::string::~string((string *)local_168);
      std::allocator<char>::~allocator(&local_169);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_148);
    }
    flattenAnnotationsForPage
              (this,(QPDFPageObjectHelper *)
                    resources.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
               (QPDFObjectHandle *)local_100,(QPDFAcroFormDocumentHelper *)local_38,
               afdh.m.
               super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               (int)afdh.m.
                    super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_100);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin1);
  bVar1 = QPDFAcroFormDocumentHelper::getNeedAppearances((QPDFAcroFormDocumentHelper *)local_38);
  if (!bVar1) {
    QPDF::getRoot((QPDF *)&local_190);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"/AcroForm",&local_1b1);
    QPDFObjectHandle::removeKey(&local_190,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    QPDFObjectHandle::~QPDFObjectHandle(&local_190);
  }
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)local_38);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::flattenAnnotations(int required_flags, int forbidden_flags)
{
    QPDFAcroFormDocumentHelper afdh(this->qpdf);
    if (afdh.getNeedAppearances()) {
        this->qpdf.getRoot()
            .getKey("/AcroForm")
            .warnIfPossible(
                "document does not have updated appearance streams, so form fields "
                "will not be flattened");
    }
    for (auto& ph: getAllPages()) {
        QPDFObjectHandle resources = ph.getAttribute("/Resources", true);
        if (!resources.isDictionary()) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper flatten resources missing or invalid");
            resources = ph.getObjectHandle().replaceKeyAndGetNew(
                "/Resources", QPDFObjectHandle::newDictionary());
        }
        flattenAnnotationsForPage(ph, resources, afdh, required_flags, forbidden_flags);
    }
    if (!afdh.getNeedAppearances()) {
        this->qpdf.getRoot().removeKey("/AcroForm");
    }
}